

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_shared_mutex.hpp
# Opt level: O0

bool __thiscall
yamc::fair::basic_shared_mutex<yamc::rwlock::PhaseFairness>::try_lock
          (basic_shared_mutex<yamc::rwlock::PhaseFairness> *this)

{
  bool bVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lk;
  mutex *this_local;
  
  lk._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,(mutex_type *)(this + 0x60));
  bVar1 = detail::shared_mutex_base<yamc::rwlock::PhaseFairness>::impl_try_lock
                    ((shared_mutex_base<yamc::rwlock::PhaseFairness> *)this);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return bVar1;
}

Assistant:

bool try_lock()
  {
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    return base::impl_try_lock();
  }